

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O1

void h2v2_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  uint uVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  JSAMPLE *pJVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  JSAMPROW pJVar7;
  long lVar8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  byte *pbVar14;
  long lVar15;
  byte *pbVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  _func_void_j_decompress_ptr *p_Var20;
  long lVar21;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var22;
  byte *local_68;
  byte *local_60;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var9 = pjVar3[1].upsample;
    lVar15 = *(long *)&pjVar3[1].need_context_rows;
    p_Var20 = pjVar3[2].start_pass;
    p_Var22 = pjVar3[2].upsample;
    local_60 = (*input_buf)[in_row_group_ctr * 2];
    local_68 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar14 = input_buf[1][in_row_group_ctr];
    pbVar12 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar1 = cinfo->output_width;
    if (uVar1 < 2) goto LAB_00127619;
    lVar21 = 0;
    lVar10 = 0;
    do {
      lVar13 = (long)*(int *)(p_Var9 + (ulong)pbVar12[lVar10] * 4);
      lVar18 = *(long *)(p_Var20 + (ulong)pbVar12[lVar10] * 8);
      lVar8 = *(long *)(p_Var22 + (ulong)pbVar14[lVar10] * 8);
      lVar17 = (long)*(int *)(lVar15 + (ulong)pbVar14[lVar10] * 4);
      uVar6 = (ulong)local_60[lVar10 * 2];
      *pJVar7 = pJVar4[lVar13 + uVar6];
      lVar18 = (long)(int)((ulong)(lVar18 + lVar8) >> 0x10);
      pJVar7[1] = pJVar4[uVar6 + lVar18];
      pJVar7[2] = pJVar4[uVar6 + lVar17];
      uVar6 = (ulong)local_60[lVar10 * 2 + 1];
      pJVar7[3] = pJVar4[lVar13 + uVar6];
      pJVar7[4] = pJVar4[uVar6 + lVar18];
      pJVar7[5] = pJVar4[uVar6 + lVar17];
      uVar6 = (ulong)local_68[lVar10 * 2];
      *pJVar5 = pJVar4[lVar13 + uVar6];
      pJVar5[1] = pJVar4[uVar6 + lVar18];
      pJVar5[2] = pJVar4[uVar6 + lVar17];
      uVar6 = (ulong)local_68[lVar10 * 2 + 1];
      pJVar5[3] = pJVar4[lVar13 + uVar6];
      pJVar5[4] = pJVar4[lVar18 + uVar6];
      pJVar5[5] = pJVar4[lVar17 + uVar6];
      pJVar7 = pJVar7 + 6;
      pJVar5 = pJVar5 + 6;
      lVar10 = lVar10 + 1;
      lVar21 = lVar21 + -2;
    } while (uVar1 >> 1 != (uint)lVar10);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var9 = pjVar3[1].upsample;
    lVar15 = *(long *)&pjVar3[1].need_context_rows;
    p_Var20 = pjVar3[2].start_pass;
    p_Var22 = pjVar3[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr * 2];
    pbVar12 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar11 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar1 = cinfo->output_width;
    if (1 < uVar1) {
      lVar18 = 0;
      lVar10 = 0;
      lVar21 = 0;
      do {
        lVar8 = *(long *)(p_Var20 + (ulong)pbVar11[lVar21] * 8);
        lVar13 = *(long *)(p_Var22 + (ulong)pbVar16[lVar21] * 8);
        lVar19 = (long)*(int *)(p_Var9 + (ulong)pbVar11[lVar21] * 4);
        lVar17 = (long)*(int *)(lVar15 + (ulong)pbVar16[lVar21] * 4);
        uVar6 = (ulong)pbVar14[lVar21 * 2];
        pJVar7[lVar21 * 8] = pJVar4[lVar19 + uVar6];
        lVar8 = (long)(int)((ulong)(lVar8 + lVar13) >> 0x10);
        pJVar7[lVar21 * 8 + 1] = pJVar4[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 2] = pJVar4[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 3] = 0xff;
        uVar6 = (ulong)pbVar14[lVar21 * 2 + 1];
        pJVar7[lVar21 * 8 + 4] = pJVar4[lVar19 + uVar6];
        pJVar7[lVar21 * 8 + 5] = pJVar4[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 6] = pJVar4[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 7] = 0xff;
        uVar6 = (ulong)pbVar12[lVar21 * 2];
        pJVar5[lVar21 * 8] = pJVar4[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 1] = pJVar4[uVar6 + lVar8];
        pJVar5[lVar21 * 8 + 2] = pJVar4[uVar6 + lVar17];
        pJVar5[lVar21 * 8 + 3] = 0xff;
        uVar6 = (ulong)pbVar12[lVar21 * 2 + 1];
        pJVar5[lVar21 * 8 + 4] = pJVar4[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 5] = pJVar4[lVar8 + uVar6];
        pJVar5[lVar21 * 8 + 6] = pJVar4[lVar17 + uVar6];
        pJVar5[lVar21 * 8 + 7] = 0xff;
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + -2;
        lVar18 = lVar18 + -8;
      } while (uVar1 >> 1 != (uint)lVar21);
      pbVar11 = pbVar11 + lVar21;
      pbVar16 = pbVar16 + lVar21;
      pbVar12 = pbVar12 + -lVar10;
      pbVar14 = pbVar14 + -lVar10;
      pJVar5 = pJVar5 + -lVar18;
      pJVar7 = pJVar7 + -lVar18;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar11 * 4);
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar11 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar15 = (long)*(int *)(lVar15 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar14;
    *pJVar7 = pJVar4[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[1] = pJVar4[uVar6 + lVar10];
    pJVar7[2] = pJVar4[uVar6 + lVar15];
    pJVar7[3] = 0xff;
    uVar6 = (ulong)*pbVar12;
    *pJVar5 = pJVar4[lVar18 + uVar6];
    pJVar5[1] = pJVar4[lVar10 + uVar6];
    pJVar5[2] = pJVar4[lVar15 + uVar6];
    goto LAB_00126e71;
  case JCS_EXT_BGR:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var9 = pjVar3[1].upsample;
    lVar15 = *(long *)&pjVar3[1].need_context_rows;
    p_Var20 = pjVar3[2].start_pass;
    p_Var22 = pjVar3[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr * 2];
    pbVar12 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar11 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar1 = cinfo->output_width;
    if (1 < uVar1) {
      lVar21 = 0;
      lVar10 = 0;
      do {
        lVar13 = (long)*(int *)(p_Var9 + (ulong)pbVar11[lVar10] * 4);
        lVar18 = *(long *)(p_Var20 + (ulong)pbVar11[lVar10] * 8);
        lVar8 = *(long *)(p_Var22 + (ulong)pbVar16[lVar10] * 8);
        lVar17 = (long)*(int *)(lVar15 + (ulong)pbVar16[lVar10] * 4);
        uVar6 = (ulong)pbVar14[lVar10 * 2];
        pJVar7[2] = pJVar4[lVar13 + uVar6];
        lVar18 = (long)(int)((ulong)(lVar18 + lVar8) >> 0x10);
        pJVar7[1] = pJVar4[uVar6 + lVar18];
        *pJVar7 = pJVar4[uVar6 + lVar17];
        uVar6 = (ulong)pbVar14[lVar10 * 2 + 1];
        pJVar7[5] = pJVar4[lVar13 + uVar6];
        pJVar7[4] = pJVar4[uVar6 + lVar18];
        pJVar7[3] = pJVar4[uVar6 + lVar17];
        uVar6 = (ulong)pbVar12[lVar10 * 2];
        pJVar5[2] = pJVar4[lVar13 + uVar6];
        pJVar5[1] = pJVar4[uVar6 + lVar18];
        *pJVar5 = pJVar4[uVar6 + lVar17];
        uVar6 = (ulong)pbVar12[lVar10 * 2 + 1];
        pJVar5[5] = pJVar4[lVar13 + uVar6];
        pJVar5[4] = pJVar4[lVar18 + uVar6];
        pJVar5[3] = pJVar4[lVar17 + uVar6];
        pJVar7 = pJVar7 + 6;
        pJVar5 = pJVar5 + 6;
        lVar10 = lVar10 + 1;
        lVar21 = lVar21 + -2;
      } while (uVar1 >> 1 != (uint)lVar10);
      pbVar11 = pbVar11 + lVar10;
      pbVar16 = pbVar16 + lVar10;
      pbVar12 = pbVar12 + -lVar21;
      pbVar14 = pbVar14 + -lVar21;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar11 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar11 * 4);
    lVar15 = (long)*(int *)(lVar15 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar14;
    pJVar7[2] = pJVar4[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[1] = pJVar4[uVar6 + lVar10];
    *pJVar7 = pJVar4[uVar6 + lVar15];
    uVar6 = (ulong)*pbVar12;
    pJVar5[2] = pJVar4[lVar18 + uVar6];
    pJVar5[1] = pJVar4[lVar10 + uVar6];
    *pJVar5 = pJVar4[lVar15 + uVar6];
    return;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var9 = pjVar3[1].upsample;
    lVar15 = *(long *)&pjVar3[1].need_context_rows;
    p_Var20 = pjVar3[2].start_pass;
    p_Var22 = pjVar3[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr * 2];
    pbVar12 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar11 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar1 = cinfo->output_width;
    if (1 < uVar1) {
      lVar18 = 0;
      lVar10 = 0;
      lVar21 = 0;
      do {
        lVar8 = *(long *)(p_Var20 + (ulong)pbVar11[lVar21] * 8);
        lVar13 = *(long *)(p_Var22 + (ulong)pbVar16[lVar21] * 8);
        lVar19 = (long)*(int *)(p_Var9 + (ulong)pbVar11[lVar21] * 4);
        lVar17 = (long)*(int *)(lVar15 + (ulong)pbVar16[lVar21] * 4);
        uVar6 = (ulong)pbVar14[lVar21 * 2];
        pJVar7[lVar21 * 8 + 2] = pJVar4[lVar19 + uVar6];
        lVar8 = (long)(int)((ulong)(lVar8 + lVar13) >> 0x10);
        pJVar7[lVar21 * 8 + 1] = pJVar4[uVar6 + lVar8];
        pJVar7[lVar21 * 8] = pJVar4[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 3] = 0xff;
        uVar6 = (ulong)pbVar14[lVar21 * 2 + 1];
        pJVar7[lVar21 * 8 + 6] = pJVar4[lVar19 + uVar6];
        pJVar7[lVar21 * 8 + 5] = pJVar4[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 4] = pJVar4[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 7] = 0xff;
        uVar6 = (ulong)pbVar12[lVar21 * 2];
        pJVar5[lVar21 * 8 + 2] = pJVar4[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 1] = pJVar4[uVar6 + lVar8];
        pJVar5[lVar21 * 8] = pJVar4[uVar6 + lVar17];
        pJVar5[lVar21 * 8 + 3] = 0xff;
        uVar6 = (ulong)pbVar12[lVar21 * 2 + 1];
        pJVar5[lVar21 * 8 + 6] = pJVar4[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 5] = pJVar4[lVar8 + uVar6];
        pJVar5[lVar21 * 8 + 4] = pJVar4[lVar17 + uVar6];
        pJVar5[lVar21 * 8 + 7] = 0xff;
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + -2;
        lVar18 = lVar18 + -8;
      } while (uVar1 >> 1 != (uint)lVar21);
      pbVar11 = pbVar11 + lVar21;
      pbVar16 = pbVar16 + lVar21;
      pbVar12 = pbVar12 + -lVar10;
      pbVar14 = pbVar14 + -lVar10;
      pJVar5 = pJVar5 + -lVar18;
      pJVar7 = pJVar7 + -lVar18;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar11 * 4);
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar11 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar15 = (long)*(int *)(lVar15 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar14;
    pJVar7[2] = pJVar4[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[1] = pJVar4[uVar6 + lVar10];
    *pJVar7 = pJVar4[uVar6 + lVar15];
    pJVar7[3] = 0xff;
    uVar6 = (ulong)*pbVar12;
    pJVar5[2] = pJVar4[lVar18 + uVar6];
    pJVar5[1] = pJVar4[lVar10 + uVar6];
    *pJVar5 = pJVar4[lVar15 + uVar6];
LAB_00126e71:
    pJVar5[3] = 0xff;
    return;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var9 = pjVar3[1].upsample;
    lVar15 = *(long *)&pjVar3[1].need_context_rows;
    p_Var20 = pjVar3[2].start_pass;
    p_Var22 = pjVar3[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr * 2];
    pbVar12 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar11 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar1 = cinfo->output_width;
    if (1 < uVar1) {
      lVar18 = 0;
      lVar10 = 0;
      lVar21 = 0;
      do {
        lVar8 = *(long *)(p_Var20 + (ulong)pbVar11[lVar21] * 8);
        lVar13 = *(long *)(p_Var22 + (ulong)pbVar16[lVar21] * 8);
        lVar19 = (long)*(int *)(p_Var9 + (ulong)pbVar11[lVar21] * 4);
        lVar17 = (long)*(int *)(lVar15 + (ulong)pbVar16[lVar21] * 4);
        uVar6 = (ulong)pbVar14[lVar21 * 2];
        pJVar7[lVar21 * 8 + 3] = pJVar4[lVar19 + uVar6];
        lVar8 = (long)(int)((ulong)(lVar8 + lVar13) >> 0x10);
        pJVar7[lVar21 * 8 + 2] = pJVar4[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 1] = pJVar4[uVar6 + lVar17];
        pJVar7[lVar21 * 8] = 0xff;
        uVar6 = (ulong)pbVar14[lVar21 * 2 + 1];
        pJVar7[lVar21 * 8 + 7] = pJVar4[lVar19 + uVar6];
        pJVar7[lVar21 * 8 + 6] = pJVar4[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 5] = pJVar4[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 4] = 0xff;
        uVar6 = (ulong)pbVar12[lVar21 * 2];
        pJVar5[lVar21 * 8 + 3] = pJVar4[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 2] = pJVar4[uVar6 + lVar8];
        pJVar5[lVar21 * 8 + 1] = pJVar4[uVar6 + lVar17];
        pJVar5[lVar21 * 8] = 0xff;
        uVar6 = (ulong)pbVar12[lVar21 * 2 + 1];
        pJVar5[lVar21 * 8 + 7] = pJVar4[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 6] = pJVar4[lVar8 + uVar6];
        pJVar5[lVar21 * 8 + 5] = pJVar4[lVar17 + uVar6];
        pJVar5[lVar21 * 8 + 4] = 0xff;
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + -2;
        lVar18 = lVar18 + -8;
      } while (uVar1 >> 1 != (uint)lVar21);
      pbVar11 = pbVar11 + lVar21;
      pbVar16 = pbVar16 + lVar21;
      pbVar12 = pbVar12 + -lVar10;
      pbVar14 = pbVar14 + -lVar10;
      pJVar5 = pJVar5 + -lVar18;
      pJVar7 = pJVar7 + -lVar18;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar11 * 4);
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar11 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar15 = (long)*(int *)(lVar15 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar14;
    pJVar7[3] = pJVar4[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[2] = pJVar4[uVar6 + lVar10];
    pJVar7[1] = pJVar4[uVar6 + lVar15];
    *pJVar7 = 0xff;
    uVar6 = (ulong)*pbVar12;
    pJVar5[3] = pJVar4[lVar18 + uVar6];
    pJVar5[2] = pJVar4[lVar10 + uVar6];
    pJVar5[1] = pJVar4[lVar15 + uVar6];
    goto LAB_001270d8;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var9 = pjVar3[1].upsample;
    lVar15 = *(long *)&pjVar3[1].need_context_rows;
    p_Var20 = pjVar3[2].start_pass;
    p_Var22 = pjVar3[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr * 2];
    pbVar12 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar11 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar1 = cinfo->output_width;
    if (1 < uVar1) {
      lVar18 = 0;
      lVar10 = 0;
      lVar21 = 0;
      do {
        lVar8 = *(long *)(p_Var20 + (ulong)pbVar11[lVar21] * 8);
        lVar13 = *(long *)(p_Var22 + (ulong)pbVar16[lVar21] * 8);
        lVar19 = (long)*(int *)(p_Var9 + (ulong)pbVar11[lVar21] * 4);
        lVar17 = (long)*(int *)(lVar15 + (ulong)pbVar16[lVar21] * 4);
        uVar6 = (ulong)pbVar14[lVar21 * 2];
        pJVar7[lVar21 * 8 + 1] = pJVar4[lVar19 + uVar6];
        lVar8 = (long)(int)((ulong)(lVar8 + lVar13) >> 0x10);
        pJVar7[lVar21 * 8 + 2] = pJVar4[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 3] = pJVar4[uVar6 + lVar17];
        pJVar7[lVar21 * 8] = 0xff;
        uVar6 = (ulong)pbVar14[lVar21 * 2 + 1];
        pJVar7[lVar21 * 8 + 5] = pJVar4[lVar19 + uVar6];
        pJVar7[lVar21 * 8 + 6] = pJVar4[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 7] = pJVar4[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 4] = 0xff;
        uVar6 = (ulong)pbVar12[lVar21 * 2];
        pJVar5[lVar21 * 8 + 1] = pJVar4[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 2] = pJVar4[uVar6 + lVar8];
        pJVar5[lVar21 * 8 + 3] = pJVar4[uVar6 + lVar17];
        pJVar5[lVar21 * 8] = 0xff;
        uVar6 = (ulong)pbVar12[lVar21 * 2 + 1];
        pJVar5[lVar21 * 8 + 5] = pJVar4[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 6] = pJVar4[lVar8 + uVar6];
        pJVar5[lVar21 * 8 + 7] = pJVar4[lVar17 + uVar6];
        pJVar5[lVar21 * 8 + 4] = 0xff;
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + -2;
        lVar18 = lVar18 + -8;
      } while (uVar1 >> 1 != (uint)lVar21);
      pbVar11 = pbVar11 + lVar21;
      pbVar16 = pbVar16 + lVar21;
      pbVar12 = pbVar12 + -lVar10;
      pbVar14 = pbVar14 + -lVar10;
      pJVar5 = pJVar5 + -lVar18;
      pJVar7 = pJVar7 + -lVar18;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar11 * 4);
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar11 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar15 = (long)*(int *)(lVar15 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar14;
    pJVar7[1] = pJVar4[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[2] = pJVar4[uVar6 + lVar10];
    pJVar7[3] = pJVar4[uVar6 + lVar15];
    *pJVar7 = 0xff;
    uVar6 = (ulong)*pbVar12;
    pJVar5[1] = pJVar4[lVar18 + uVar6];
    pJVar5[2] = pJVar4[lVar10 + uVar6];
    pJVar5[3] = pJVar4[lVar15 + uVar6];
LAB_001270d8:
    *pJVar5 = 0xff;
    return;
  default:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var9 = pjVar3[1].upsample;
    lVar15 = *(long *)&pjVar3[1].need_context_rows;
    p_Var20 = pjVar3[2].start_pass;
    p_Var22 = pjVar3[2].upsample;
    local_60 = (*input_buf)[in_row_group_ctr * 2];
    local_68 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar14 = input_buf[1][in_row_group_ctr];
    pbVar12 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar1 = cinfo->output_width;
    if (uVar1 < 2) goto LAB_00127619;
    lVar21 = 0;
    lVar10 = 0;
    do {
      lVar13 = (long)*(int *)(p_Var9 + (ulong)pbVar12[lVar10] * 4);
      lVar18 = *(long *)(p_Var20 + (ulong)pbVar12[lVar10] * 8);
      lVar8 = *(long *)(p_Var22 + (ulong)pbVar14[lVar10] * 8);
      lVar17 = (long)*(int *)(lVar15 + (ulong)pbVar14[lVar10] * 4);
      uVar6 = (ulong)local_60[lVar10 * 2];
      *pJVar7 = pJVar4[lVar13 + uVar6];
      lVar18 = (long)(int)((ulong)(lVar18 + lVar8) >> 0x10);
      pJVar7[1] = pJVar4[uVar6 + lVar18];
      pJVar7[2] = pJVar4[uVar6 + lVar17];
      uVar6 = (ulong)local_60[lVar10 * 2 + 1];
      pJVar7[3] = pJVar4[lVar13 + uVar6];
      pJVar7[4] = pJVar4[uVar6 + lVar18];
      pJVar7[5] = pJVar4[uVar6 + lVar17];
      uVar6 = (ulong)local_68[lVar10 * 2];
      *pJVar5 = pJVar4[lVar13 + uVar6];
      pJVar5[1] = pJVar4[uVar6 + lVar18];
      pJVar5[2] = pJVar4[uVar6 + lVar17];
      uVar6 = (ulong)local_68[lVar10 * 2 + 1];
      pJVar5[3] = pJVar4[lVar13 + uVar6];
      pJVar5[4] = pJVar4[lVar18 + uVar6];
      pJVar5[5] = pJVar4[lVar17 + uVar6];
      pJVar7 = pJVar7 + 6;
      pJVar5 = pJVar5 + 6;
      lVar10 = lVar10 + 1;
      lVar21 = lVar21 + -2;
    } while (uVar1 >> 1 != (uint)lVar10);
  }
  pbVar12 = pbVar12 + lVar10;
  pbVar14 = pbVar14 + lVar10;
  local_68 = local_68 + -lVar21;
  local_60 = local_60 + -lVar21;
LAB_00127619:
  if ((cinfo->output_width & 1) != 0) {
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar12 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar14 * 8);
    iVar2 = *(int *)(p_Var9 + (ulong)*pbVar12 * 4);
    lVar15 = (long)*(int *)(lVar15 + (ulong)*pbVar14 * 4);
    uVar6 = (ulong)*local_60;
    *pJVar7 = pJVar4[(long)iVar2 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[1] = pJVar4[uVar6 + lVar10];
    pJVar7[2] = pJVar4[uVar6 + lVar15];
    uVar6 = (ulong)*local_68;
    *pJVar5 = pJVar4[(long)iVar2 + uVar6];
    pJVar5[1] = pJVar4[lVar10 + uVar6];
    pJVar5[2] = pJVar4[lVar15 + uVar6];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    extrgb_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_BGR:
    extbgr_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  default:
    h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                  output_buf);
    break;
  }
}